

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

char * icetStrategyNameFromEnum(IceTEnum strategy)

{
  char *pcStack_10;
  IceTEnum strategy_local;
  
  if (strategy == 0xffffffff) {
    icetRaiseDiagnostic("Strategy not defined. Use icetStrategy to set the strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x4d);
    pcStack_10 = "<Not Set>";
  }
  else if (strategy == 0x6001) {
    pcStack_10 = "Direct";
  }
  else if (strategy == 0x6002) {
    pcStack_10 = "Sequential";
  }
  else if (strategy == 0x6003) {
    pcStack_10 = "Split";
  }
  else if (strategy == 0x6004) {
    pcStack_10 = "Reduce";
  }
  else if (strategy == 0x6005) {
    pcStack_10 = "Virtual Tree";
  }
  else {
    icetRaiseDiagnostic("Invalid strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x50);
    pcStack_10 = "<Invalid>";
  }
  return pcStack_10;
}

Assistant:

const char *icetStrategyNameFromEnum(IceTEnum strategy)
{
    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return "Direct";
      case ICET_STRATEGY_SEQUENTIAL:    return "Sequential";
      case ICET_STRATEGY_SPLIT:         return "Split";
      case ICET_STRATEGY_REDUCE:        return "Reduce";
      case ICET_STRATEGY_VTREE:         return "Virtual Tree";
      case ICET_STRATEGY_UNDEFINED:
          icetRaiseError("Strategy not defined. "
                         "Use icetStrategy to set the strategy.",
                         ICET_INVALID_ENUM);
          return "<Not Set>";
      default:
          icetRaiseError("Invalid strategy.", ICET_INVALID_ENUM);
          return "<Invalid>";
    }
}